

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_rldinm(DisasContext_conflict10 *ctx,int mb,int me,int sh)

{
  uint uVar1;
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 ret;
  TCGv_i64 arg1;
  ulong arg2;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  ret = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0xd & 0xf8));
  arg1 = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8));
  uVar1 = (me - mb) + 1;
  if (0x3f - sh == me && (-1 < me - mb && sh != 0)) {
    tcg_gen_deposit_z_i64_ppc64(tcg_ctx,ret,arg1,sh,uVar1);
  }
  else if ((int)((-sh & 0x3fU) + uVar1) < 0x41 && me == 0x3f) {
    tcg_gen_extract_i64_ppc64(tcg_ctx,ret,arg1,-sh & 0x3fU,uVar1);
  }
  else {
    tcg_gen_rotli_i64_ppc64(tcg_ctx,ret,arg1,sh);
    if (mb == 0) {
      arg2 = -1L << (~(byte)me & 0x3f);
    }
    else {
      arg2 = 0xffffffffffffffff >> ((byte)mb & 0x3f);
      if ((me != 0x3f) &&
         (arg2 = arg2 ^ 0x7fffffffffffffffU >> ((byte)me & 0x3f), (uint)me < (uint)mb)) {
        arg2 = ~arg2;
      }
    }
    tcg_gen_andi_i64_ppc64(tcg_ctx,ret,ret,arg2);
  }
  if ((ctx->opcode & 1) == 0) {
    return;
  }
  uVar1._0_1_ = ctx->sf_mode;
  uVar1._1_1_ = ctx->has_cfar;
  uVar1._2_1_ = ctx->fpu_enabled;
  uVar1._3_1_ = ctx->altivec_enabled;
  gen_set_Rc0((DisasContext_conflict10 *)(ulong)uVar1,(TCGv_i64)ctx->uc->tcg_ctx);
  return;
}

Assistant:

static void gen_rldinm(DisasContext *ctx, int mb, int me, int sh)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t_ra = cpu_gpr[rA(ctx->opcode)];
    TCGv t_rs = cpu_gpr[rS(ctx->opcode)];
    int len = me - mb + 1;
    int rsh = (64 - sh) & 63;

    if (sh != 0 && len > 0 && me == (63 - sh)) {
        tcg_gen_deposit_z_tl(tcg_ctx, t_ra, t_rs, sh, len);
    } else if (me == 63 && rsh + len <= 64) {
        tcg_gen_extract_tl(tcg_ctx, t_ra, t_rs, rsh, len);
    } else {
        tcg_gen_rotli_tl(tcg_ctx, t_ra, t_rs, sh);
        tcg_gen_andi_tl(tcg_ctx, t_ra, t_ra, MASK(mb, me));
    }
    if (unlikely(Rc(ctx->opcode) != 0)) {
        gen_set_Rc0(ctx, t_ra);
    }
}